

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O3

SRes LzmaDec_AllocateProbs2(CLzmaDec *p,CLzmaProps *propNew,ISzAlloc *alloc)

{
  UInt16 *pUVar1;
  undefined8 *in_RCX;
  UInt32 UVar2;
  
  UVar2 = (0x300 << ((char)propNew + (char)alloc & 0x1fU)) + 0x736;
  if ((p->probs == (UInt16 *)0x0) || (UVar2 != p->numProbs)) {
    (*(code *)in_RCX[1])();
    p->probs = (UInt16 *)0x0;
    pUVar1 = (UInt16 *)(*(code *)*in_RCX)();
    p->probs = pUVar1;
    p->numProbs = UVar2;
    if (pUVar1 == (UInt16 *)0x0) {
      return 2;
    }
  }
  return 0;
}

Assistant:

static SRes LzmaDec_AllocateProbs2(CLzmaDec *p, const CLzmaProps *propNew, ISzAlloc *alloc)
{
  UInt32 numProbs = LzmaProps_GetNumProbs(propNew);
  if (!p->probs || numProbs != p->numProbs)
  {
    LzmaDec_FreeProbs(p, alloc);
    p->probs = (CLzmaProb *)alloc->Alloc(alloc, numProbs * sizeof(CLzmaProb));
    p->numProbs = numProbs;
    if (!p->probs)
      return SZ_ERROR_MEM;
  }
  return SZ_OK;
}